

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O2

ugui_menu_widget_t * ugui_menu_widget_create(ugui_rect_t bounds)

{
  ugui_menu_widget_t *ctx;
  ugui_layer_t *layer;
  
  ctx = (ugui_menu_widget_t *)malloc(0x60);
  layer = ugui_layer_create(bounds);
  ctx->widget_layer = layer;
  ctx->selected = 0;
  ctx->offset = 0;
  (ctx->draw_callbacks).draw_header = ugui_menu_widget_basic_header_draw;
  (ctx->draw_callbacks).draw_row = ugui_menu_widget_basic_cell_draw;
  (ctx->draw_callbacks).get_header_height = ugui_menu_widget_basic_get_header_height;
  (ctx->draw_callbacks).get_cell_height = ugui_menu_widget_basic_get_cell_height;
  ugui_layer_set_update(layer,menu_widget_layer_update);
  ugui_layer_set_ctx(layer,ctx);
  return ctx;
}

Assistant:

ugui_menu_widget_t *ugui_menu_widget_create(ugui_rect_t bounds) {
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*)malloc(sizeof(ugui_menu_widget_t));

	menu_widget->widget_layer = ugui_layer_create(bounds);

	//Set location information
	menu_widget->selected = 0;
	menu_widget->offset = 0;

	//Default draw callbacks
	menu_widget->draw_callbacks.draw_header = ugui_menu_widget_basic_header_draw;
	menu_widget->draw_callbacks.draw_row = ugui_menu_widget_basic_cell_draw;
	menu_widget->draw_callbacks.get_header_height = ugui_menu_widget_basic_get_header_height;
	menu_widget->draw_callbacks.get_cell_height = ugui_menu_widget_basic_get_cell_height;

	//Bind update method
	ugui_layer_set_update(menu_widget->widget_layer, menu_widget_layer_update);
	//Bind menu_widget instance to layer context for use in update and other calls
	ugui_layer_set_ctx(menu_widget->widget_layer, (void*) menu_widget);

	return menu_widget;
}